

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::Program::FreeBody(Program *this,ArenaAllocator *rtAllocator)

{
  code *pcVar1;
  bool bVar2;
  uchar **ppuVar3;
  undefined4 *puVar4;
  nullptr_t local_350;
  Inst *local_348;
  EndAssertionInst *actualInst_99;
  BeginAssertionInst *actualInst_98;
  TryMatchSetInst *actualInst_97;
  TryIfSetInst *actualInst_96;
  TryMatchCharInst *actualInst_95;
  TryIfCharInst *actualInst_94;
  TryInst *actualInst_93;
  ChompSetBoundedGroupLastCharInst *actualInst_92;
  ChompSetBoundedInst *actualInst_91;
  ChompCharBoundedInst *actualInst_90;
  ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *actualInst_89;
  ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *actualInst_88;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *actualInst_87;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *actualInst_86;
  ChompSetInst<(UnifiedRegex::ChompMode)1> *actualInst_85;
  ChompSetInst<(UnifiedRegex::ChompMode)0> *actualInst_84;
  ChompCharInst<(UnifiedRegex::ChompMode)1> *actualInst_83;
  ChompCharInst<(UnifiedRegex::ChompMode)0> *actualInst_82;
  RepeatGreedyLoopNoBacktrackInst *actualInst_81;
  BeginGreedyLoopNoBacktrackInst *actualInst_80;
  RepeatLoopFixedGroupLastIterationInst *actualInst_79;
  BeginLoopFixedGroupLastIterationInst *actualInst_78;
  LoopSetWithFollowFirstInst *actualInst_77;
  LoopSetInst *actualInst_76;
  RepeatLoopFixedInst *actualInst_75;
  BeginLoopFixedInst *actualInst_74;
  RepeatLoopIfSetInst *actualInst_73;
  RepeatLoopIfCharInst *actualInst_72;
  BeginLoopIfSetInst *actualInst_71;
  BeginLoopIfCharInst *actualInst_70;
  RepeatLoopInst *actualInst_69;
  BeginLoopInst *actualInst_68;
  DefineGroupFixedInst *actualInst_67;
  EndDefineGroupInst *actualInst_66;
  BeginDefineGroupInst *actualInst_65;
  MatchGroupInst *actualInst_64;
  SyncToLiteralsAndBackupInst *actualInst_63;
  SyncToLiteralEquivTrivialLastPatCharAndBackupInst *actualInst_62;
  SyncToLiteralEquivAndBackupInst *actualInst_61;
  SyncToLinearLiteralAndBackupInst *actualInst_60;
  SyncToLiteralAndBackupInst *actualInst_59;
  SyncToChar2LiteralAndBackupInst *actualInst_58;
  SyncToSetAndBackupInst<true> *actualInst_57;
  SyncToSetAndBackupInst<false> *actualInst_56;
  SyncToCharAndBackupInst *actualInst_55;
  SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *actualInst_54;
  SyncToLiteralEquivAndConsumeInst *actualInst_53;
  SyncToLinearLiteralAndConsumeInst *actualInst_52;
  SyncToLiteralAndConsumeInst *actualInst_51;
  SyncToChar2LiteralAndConsumeInst *actualInst_50;
  SyncToSetAndConsumeInst<true> *actualInst_49;
  SyncToSetAndConsumeInst<false> *actualInst_48;
  SyncToChar2SetAndConsumeInst *actualInst_47;
  SyncToCharAndConsumeInst *actualInst_46;
  SyncToLiteralEquivTrivialLastPatCharAndContinueInst *actualInst_45;
  SyncToLiteralEquivAndContinueInst *actualInst_44;
  SyncToLinearLiteralAndContinueInst *actualInst_43;
  SyncToLiteralAndContinueInst *actualInst_42;
  SyncToChar2LiteralAndContinueInst *actualInst_41;
  SyncToSetAndContinueInst<true> *actualInst_40;
  SyncToSetAndContinueInst<false> *actualInst_39;
  SyncToChar2SetAndContinueInst *actualInst_38;
  SyncToCharAndContinueInst *actualInst_37;
  OptMatchSetInst *actualInst_36;
  OptMatchCharInst *actualInst_35;
  MatchTrieInst *actualInst_34;
  MatchLiteralEquivInst *actualInst_33;
  MatchLiteralInst *actualInst_32;
  MatchSetInst<true> *actualInst_31;
  MatchSetInst<false> *actualInst_30;
  MatchChar4Inst *actualInst_29;
  MatchChar3Inst *actualInst_28;
  MatchChar2Inst *actualInst_27;
  MatchCharInst *actualInst_26;
  WordBoundaryTestInst<false> *actualInst_25;
  WordBoundaryTestInst<true> *actualInst_24;
  EOLTestInst *actualInst_23;
  BOLTestInst *actualInst_22;
  EOITestInst<false> *actualInst_21;
  EOITestInst<true> *actualInst_20;
  BOITestInst<false> *actualInst_19;
  BOITestInst<true> *actualInst_18;
  SwitchAndConsume24Inst *actualInst_17;
  SwitchAndConsume16Inst *actualInst_16;
  SwitchAndConsume8Inst *actualInst_15;
  SwitchAndConsume4Inst *actualInst_14;
  SwitchAndConsume2Inst *actualInst_13;
  Switch24Inst *actualInst_12;
  Switch16Inst *actualInst_11;
  Switch8Inst *actualInst_10;
  Switch4Inst *actualInst_9;
  Switch2Inst *actualInst_8;
  MatchSetOrJumpInst *actualInst_7;
  JumpIfNotSetInst *actualInst_6;
  MatchCharOrJumpInst *actualInst_5;
  JumpIfNotCharInst *actualInst_4;
  JumpInst *actualInst_3;
  SuccInst *actualInst_2;
  FailInst *actualInst_1;
  NopInst *actualInst;
  Inst *instEnd;
  Inst *inst;
  ArenaAllocator *rtAllocator_local;
  Program *this_local;
  
  if ((this->tag == InstructionsTag) &&
     (inst = (Inst *)rtAllocator, rtAllocator_local = (ArenaAllocator *)this,
     ppuVar3 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                         ((WriteBarrierPtr *)&(this->rep).insts), *ppuVar3 != (uchar *)0x0)) {
    ppuVar3 = Memory::PointerValue<unsigned_char>(&(this->rep).insts.insts);
    instEnd = (Inst *)*ppuVar3;
    actualInst = (NopInst *)instEnd + (this->rep).insts.instsLen;
    if (actualInst <= instEnd) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x1655,"(inst < instEnd)","inst < instEnd");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    do {
      switch(instEnd->tag) {
      case Nop:
        actualInst_1 = (FailInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_1[1].super_Inst;
        break;
      case Fail:
        actualInst_2 = (SuccInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_2[1].super_Inst;
        break;
      case Succ:
        actualInst_3 = (JumpInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_3->super_JumpMixin;
        break;
      case Jump:
        actualInst_4 = (JumpIfNotCharInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_4->super_JumpMixin).targetLabel + 2);
        break;
      case JumpIfNotChar:
        actualInst_5 = (MatchCharOrJumpInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_5[1].super_Inst;
        break;
      case MatchCharOrJump:
        actualInst_6 = (JumpIfNotSetInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_6->super_SetMixin<false>).set.root + 6);
        break;
      case JumpIfNotSet:
        actualInst_7 = (MatchSetOrJumpInst *)instEnd;
        JumpIfNotSetInst::FreeBody((JumpIfNotSetInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_7[1].super_Inst;
        break;
      case MatchSetOrJump:
        actualInst_8 = (Switch2Inst *)instEnd;
        MatchSetOrJumpInst::FreeBody((MatchSetOrJumpInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_8[3].super_SwitchMixin<(unsigned_char)__x02_>.cases[0].
                                  c + 1);
        break;
      case Switch2:
        actualInst_9 = (Switch4Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_9->super_SwitchMixin<(unsigned_char)__x04_>).cases + 2);
        break;
      case Switch4:
        actualInst_10 = (Switch8Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_10->super_SwitchMixin<(unsigned_char)__b_>).cases + 4);
        break;
      case Switch8:
        actualInst_11 = (Switch16Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_11->super_SwitchMixin<(unsigned_char)__x10_>).cases + 8);
        break;
      case Switch16:
        actualInst_12 = (Switch24Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_12->super_SwitchMixin<(unsigned_char)__x18_>).cases + 0x10);
        break;
      case Switch24:
        actualInst_13 = (SwitchAndConsume2Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_13[10].super_SwitchMixin<(unsigned_char)__x02_>.cases
                                  [0].targetLabel + 2);
        break;
      case SwitchAndConsume2:
        actualInst_14 = (SwitchAndConsume4Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_14->super_SwitchMixin<(unsigned_char)__x04_>).cases + 2);
        break;
      case SwitchAndConsume4:
        actualInst_15 = (SwitchAndConsume8Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_15->super_SwitchMixin<(unsigned_char)__b_>).cases + 4);
        break;
      case SwitchAndConsume8:
        actualInst_16 = (SwitchAndConsume16Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_16->super_SwitchMixin<(unsigned_char)__x10_>).cases + 8);
        break;
      case SwitchAndConsume16:
        actualInst_17 = (SwitchAndConsume24Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_17->super_SwitchMixin<(unsigned_char)__x18_>).cases + 0x10);
        break;
      case SwitchAndConsume24:
        actualInst_18 = (BOITestInst<true> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_18[0x92].super_Inst;
        break;
      case BOIHardFailTest:
        actualInst_19 = (BOITestInst<false> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_19[1].super_Inst;
        break;
      case BOITest:
        actualInst_20 = (EOITestInst<true> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_20[1].super_Inst;
        break;
      case EOIHardFailTest:
        actualInst_21 = (EOITestInst<false> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_21[1].super_Inst;
        break;
      case EOITest:
        actualInst_22 = (BOLTestInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_22[1].super_Inst;
        break;
      case BOLTest:
        actualInst_23 = (EOLTestInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_23[1].super_Inst;
        break;
      case EOLTest:
        actualInst_24 = (WordBoundaryTestInst<true> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_24[1].super_Inst;
        break;
      case NegatedWordBoundaryTest:
        actualInst_25 = (WordBoundaryTestInst<false> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_25[1].super_Inst;
        break;
      case WordBoundaryTest:
        actualInst_26 = (MatchCharInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_26->super_CharMixin;
        break;
      case MatchChar:
        actualInst_27 = (MatchChar2Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_27->super_Char2Mixin).cs + 1);
        break;
      case MatchChar2:
        actualInst_28 = (MatchChar3Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_28->super_Char3Mixin).cs + 2);
        break;
      case MatchChar3:
        actualInst_29 = (MatchChar4Inst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_29->super_Char4Mixin).cs + 3);
        break;
      case MatchChar4:
        actualInst_30 = (MatchSetInst<false> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&(actualInst_30->super_SetMixin<false>).set.direct;
        break;
      case MatchSet:
        actualInst_31 = (MatchSetInst<true> *)instEnd;
        MatchSetInst<false>::FreeBody((MatchSetInst<false> *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_31[1].super_Inst;
        break;
      case MatchNegatedSet:
        actualInst_32 = (MatchLiteralInst *)instEnd;
        MatchSetInst<true>::FreeBody((MatchSetInst<true> *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_32[4].super_LiteralMixin.length;
        break;
      case MatchLiteral:
        actualInst_33 = (MatchLiteralEquivInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_33[1].super_Inst;
        break;
      case MatchLiteralEquiv:
        actualInst_34 = (MatchTrieInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&(actualInst_34->super_TrieMixin).trie.children;
        break;
      case MatchTrie:
        actualInst_35 = (OptMatchCharInst *)instEnd;
        MatchTrieInst::FreeBody((MatchTrieInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_35[5].super_CharMixin.c + 1);
        break;
      case OptMatchChar:
        actualInst_36 = (OptMatchSetInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_36->super_SetMixin<false>).set.root + 2);
        break;
      case OptMatchSet:
        actualInst_37 = (SyncToCharAndContinueInst *)instEnd;
        OptMatchSetInst::FreeBody((OptMatchSetInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_37[0xd].super_CharMixin.c + 1);
        break;
      case SyncToCharAndContinue:
        actualInst_38 = (SyncToChar2SetAndContinueInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_38->super_Char2Mixin).cs + 1);
        break;
      case SyncToChar2SetAndContinue:
        actualInst_39 = (SyncToSetAndContinueInst<false> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_39->super_SetMixin<false>).set.root + 4);
        break;
      case SyncToSetAndContinue:
        actualInst_40 = (SyncToSetAndContinueInst<true> *)instEnd;
        SyncToSetAndContinueInst<false>::FreeBody
                  ((SyncToSetAndContinueInst<false> *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_40[1].super_Inst;
        break;
      case SyncToNegatedSetAndContinue:
        actualInst_41 = (SyncToChar2LiteralAndContinueInst *)instEnd;
        SyncToSetAndContinueInst<true>::FreeBody
                  ((SyncToSetAndContinueInst<true> *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_41[8].
                           super_SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin>
                           .super_Char2LiteralScannerMixin;
        break;
      case SyncToChar2LiteralAndContinue:
        actualInst_42 = (SyncToLiteralAndContinueInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&(actualInst_42->
                           super_SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                           ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>.
                           super_LiteralMixin.length;
        break;
      case SyncToLiteralAndContinue:
        actualInst_43 = (SyncToLinearLiteralAndContinueInst *)instEnd;
        SyncToLiteralAndContinueInst::FreeBody
                  ((SyncToLiteralAndContinueInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_43[0x13].
                                  super_SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                                  .
                                  super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>
                                  .scanner.lastOccurrence.defv + 1);
        break;
      case SyncToLinearLiteralAndContinue:
        actualInst_44 = (SyncToLiteralEquivAndContinueInst *)instEnd;
        SyncToLinearLiteralAndContinueInst::FreeBody
                  ((SyncToLinearLiteralAndContinueInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_44->
                           super_SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>
                           ).super_EquivScannerMixinT<4U>.super_ScannerMixin.scanner.lastOccurrence.
                           directMap + 1);
        break;
      case SyncToLiteralEquivAndContinue:
        actualInst_45 = (SyncToLiteralEquivTrivialLastPatCharAndContinueInst *)instEnd;
        SyncToLiteralEquivAndContinueInst::FreeBody
                  ((SyncToLiteralEquivAndContinueInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)(actualInst_45 + 1);
        break;
      case SyncToLiteralEquivTrivialLastPatCharAndContinue:
        actualInst_46 = (SyncToCharAndConsumeInst *)instEnd;
        SyncToLiteralEquivTrivialLastPatCharAndContinueInst::FreeBody
                  ((SyncToLiteralEquivTrivialLastPatCharAndContinueInst *)instEnd,
                   (ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_46[0x16d].super_CharMixin.c + 1);
        break;
      case SyncToCharAndConsume:
        actualInst_47 = (SyncToChar2SetAndConsumeInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_47->super_Char2Mixin).cs + 1);
        break;
      case SyncToChar2SetAndConsume:
        actualInst_48 = (SyncToSetAndConsumeInst<false> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_48->super_SetMixin<false>).set.root + 4);
        break;
      case SyncToSetAndConsume:
        actualInst_49 = (SyncToSetAndConsumeInst<true> *)instEnd;
        SyncToSetAndConsumeInst<false>::FreeBody
                  ((SyncToSetAndConsumeInst<false> *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_49[1].super_Inst;
        break;
      case SyncToNegatedSetAndConsume:
        actualInst_50 = (SyncToChar2LiteralAndConsumeInst *)instEnd;
        SyncToSetAndConsumeInst<true>::FreeBody
                  ((SyncToSetAndConsumeInst<true> *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_50[8].
                           super_SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>
                           .super_Char2LiteralScannerMixin;
        break;
      case SyncToChar2LiteralAndConsume:
        actualInst_51 = (SyncToLiteralAndConsumeInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&(actualInst_51->
                           super_SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                           ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>.
                           super_LiteralMixin.length;
        break;
      case SyncToLiteralAndConsume:
        actualInst_52 = (SyncToLinearLiteralAndConsumeInst *)instEnd;
        SyncToLiteralAndConsumeInst::FreeBody
                  ((SyncToLiteralAndConsumeInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_52[0x13].
                                  super_SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
                                  .
                                  super_ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>
                                  .scanner.lastOccurrence.defv + 1);
        break;
      case SyncToLinearLiteralAndConsume:
        actualInst_53 = (SyncToLiteralEquivAndConsumeInst *)instEnd;
        SyncToLinearLiteralAndConsumeInst::FreeBody
                  ((SyncToLinearLiteralAndConsumeInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_53->
                           super_SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>
                           ).super_EquivScannerMixinT<4U>.super_ScannerMixin.scanner.lastOccurrence.
                           directMap + 1);
        break;
      case SyncToLiteralEquivAndConsume:
        actualInst_54 = (SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *)instEnd;
        SyncToLiteralEquivAndConsumeInst::FreeBody
                  ((SyncToLiteralEquivAndConsumeInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)(actualInst_54 + 1);
        break;
      case SyncToLiteralEquivTrivialLastPatCharAndConsume:
        actualInst_55 = (SyncToCharAndBackupInst *)instEnd;
        SyncToLiteralEquivTrivialLastPatCharAndConsumeInst::FreeBody
                  ((SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *)instEnd,
                   (ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_55[99].super_BackupMixin.backup.upper + 1);
        break;
      case SyncToCharAndBackup:
        actualInst_56 = (SyncToSetAndBackupInst<false> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)(actualInst_56->super_SetMixin<false>).set.direct.vec + 2);
        break;
      case SyncToSetAndBackup:
        actualInst_57 = (SyncToSetAndBackupInst<true> *)instEnd;
        SyncToSetAndBackupInst<false>::FreeBody
                  ((SyncToSetAndBackupInst<false> *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_57[1].super_Inst;
        break;
      case SyncToNegatedSetAndBackup:
        actualInst_58 = (SyncToChar2LiteralAndBackupInst *)instEnd;
        SyncToSetAndBackupInst<true>::FreeBody
                  ((SyncToSetAndBackupInst<true> *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_58[3].
                                  super_SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>
                                  .super_BackupMixin.backup.upper + 1);
        break;
      case SyncToChar2LiteralAndBackup:
        actualInst_59 = (SyncToLiteralAndBackupInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&(actualInst_59->
                           super_SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
                           ).super_ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>.
                           scanner.field_0x4;
        break;
      case SyncToLiteralAndBackup:
        actualInst_60 = (SyncToLinearLiteralAndBackupInst *)instEnd;
        SyncToLiteralAndBackupInst::FreeBody
                  ((SyncToLiteralAndBackupInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)(actualInst_60 + 0x11);
        break;
      case SyncToLinearLiteralAndBackup:
        actualInst_61 = (SyncToLiteralEquivAndBackupInst *)instEnd;
        SyncToLinearLiteralAndBackupInst::FreeBody
                  ((SyncToLinearLiteralAndBackupInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_61->
                           super_SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>)
                           .super_EquivScannerMixinT<4U>.super_ScannerMixin.scanner.lastOccurrence.
                           directMap + 3);
        break;
      case SyncToLiteralEquivAndBackup:
        actualInst_62 = (SyncToLiteralEquivTrivialLastPatCharAndBackupInst *)instEnd;
        SyncToLiteralEquivAndBackupInst::FreeBody
                  ((SyncToLiteralEquivAndBackupInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)(actualInst_62 + 1);
        break;
      case SyncToLiteralEquivTrivialLastPatCharAndBackup:
        actualInst_63 = (SyncToLiteralsAndBackupInst *)instEnd;
        SyncToLiteralEquivTrivialLastPatCharAndBackupInst::FreeBody
                  ((SyncToLiteralEquivTrivialLastPatCharAndBackupInst *)instEnd,
                   (ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_63[0x34].super_BackupMixin;
        break;
      case SyncToLiteralsAndBackup:
        actualInst_64 = (MatchGroupInst *)instEnd;
        SyncToLiteralsAndBackupInst::FreeBody
                  ((SyncToLiteralsAndBackupInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_64[4].super_GroupMixin;
        break;
      case MatchGroup:
        actualInst_65 = (BeginDefineGroupInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_65[1].super_Inst;
        break;
      case BeginDefineGroup:
        actualInst_66 = (EndDefineGroupInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_66->super_NoNeedToSaveMixin;
        break;
      case EndDefineGroup:
        actualInst_67 = (DefineGroupFixedInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_67->super_FixedLengthMixin).length + 1);
        break;
      case DefineGroupFixed:
        actualInst_68 = (BeginLoopInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_68->super_BeginLoopMixin).super_BeginLoopBasicsMixin.
                                  repeats.upper + 1);
        break;
      case BeginLoop:
        actualInst_69 = (RepeatLoopInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_69[5].super_RepeatLoopMixin.beginLabel + 2);
        break;
      case RepeatLoop:
        actualInst_70 = (BeginLoopIfCharInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_70->super_BeginLoopMixin).super_BeginLoopBasicsMixin.
                                  loopId + 2);
        break;
      case BeginLoopIfChar:
        actualInst_71 = (BeginLoopIfSetInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((actualInst_71->super_SetMixin<false>).set.direct.vec + 5);
        break;
      case BeginLoopIfSet:
        actualInst_72 = (RepeatLoopIfCharInst *)instEnd;
        BeginLoopIfSetInst::FreeBody((BeginLoopIfSetInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_72[0xd].super_RepeatLoopMixin.beginLabel + 1);
        break;
      case RepeatLoopIfChar:
        actualInst_73 = (RepeatLoopIfSetInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_73[1].super_Inst;
        break;
      case RepeatLoopIfSet:
        actualInst_74 = (BeginLoopFixedInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&(actualInst_74->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats;
        break;
      case BeginLoopFixed:
        actualInst_75 = (RepeatLoopFixedInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_75[4].super_RepeatLoopMixin.beginLabel + 2);
        break;
      case RepeatLoopFixed:
        actualInst_76 = (LoopSetInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_76->super_SetMixin<false>).set.root + 4);
        break;
      case LoopSet:
        actualInst_77 = (LoopSetWithFollowFirstInst *)instEnd;
        LoopSetInst::FreeBody((LoopSetInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_77->super_FollowFirstMixin;
        break;
      case LoopSetWithFollowFirst:
        actualInst_78 = (BeginLoopFixedGroupLastIterationInst *)instEnd;
        LoopSetInst::FreeBody((LoopSetInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_78[2].super_Inst;
        break;
      case BeginLoopFixedGroupLastIteration:
        actualInst_79 = (RepeatLoopFixedGroupLastIterationInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_79[5].super_RepeatLoopMixin.beginLabel + 2);
        break;
      case RepeatLoopFixedGroupLastIteration:
        actualInst_80 = (BeginGreedyLoopNoBacktrackInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&(actualInst_80->super_GreedyLoopNoBacktrackMixin).exitLabel;
        break;
      case BeginGreedyLoopNoBacktrack:
        actualInst_81 = (RepeatGreedyLoopNoBacktrackInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_81[1].super_RepeatLoopMixin.beginLabel + 3);
        break;
      case RepeatGreedyLoopNoBacktrack:
        actualInst_82 = (ChompCharInst<(UnifiedRegex::ChompMode)0> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_82[1].super_CharMixin.c + 1);
        break;
      case ChompCharStar:
        actualInst_83 = (ChompCharInst<(UnifiedRegex::ChompMode)1> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_83[1].super_Inst;
        break;
      case ChompCharPlus:
        actualInst_84 = (ChompSetInst<(UnifiedRegex::ChompMode)0> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_84->super_SetMixin<false>).set.root + 2);
        break;
      case ChompSetStar:
        actualInst_85 = (ChompSetInst<(UnifiedRegex::ChompMode)1> *)instEnd;
        ChompSetInst<(UnifiedRegex::ChompMode)0>::FreeBody
                  ((ChompSetInst<(UnifiedRegex::ChompMode)0> *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_85[1].super_Inst;
        break;
      case ChompSetPlus:
        actualInst_86 = (ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *)instEnd;
        ChompSetInst<(UnifiedRegex::ChompMode)1>::FreeBody
                  ((ChompSetInst<(UnifiedRegex::ChompMode)1> *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_86[5].super_CharMixin;
        break;
      case ChompCharGroupStar:
        actualInst_87 = (ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_87[1].super_Inst;
        break;
      case ChompCharGroupPlus:
        actualInst_88 = (ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_88->super_SetMixin<false>).set.root + 7);
        break;
      case ChompSetGroupStar:
        actualInst_89 = (ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)instEnd;
        ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::FreeBody
                  ((ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_89[1].super_Inst;
        break;
      case ChompSetGroupPlus:
        actualInst_90 = (ChompCharBoundedInst *)instEnd;
        ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::FreeBody
                  ((ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_90[4].super_CharMixin.c + 1);
        break;
      case ChompCharBounded:
        actualInst_91 = (ChompSetBoundedInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)(actualInst_91->super_SetMixin<false>).set.direct.vec + 2);
        break;
      case ChompSetBounded:
        actualInst_92 = (ChompSetBoundedGroupLastCharInst *)instEnd;
        ChompSetBoundedInst::FreeBody((ChompSetBoundedInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)&actualInst_92->super_GroupMixin;
        break;
      case ChompSetBoundedGroupLastChar:
        actualInst_93 = (TryInst *)instEnd;
        ChompSetBoundedGroupLastCharInst::FreeBody
                  ((ChompSetBoundedGroupLastCharInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_93[10].super_TryMixin.failLabel + 3);
        break;
      case Try:
        actualInst_94 = (TryIfCharInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_94->super_TryMixin).failLabel + 2);
        break;
      case TryIfChar:
        actualInst_95 = (TryMatchCharInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_95[1].super_Inst;
        break;
      case TryMatchChar:
        actualInst_96 = (TryIfSetInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&(actualInst_96->super_SetMixin<false>).set.root + 6);
        break;
      case TryIfSet:
        actualInst_97 = (TryMatchSetInst *)instEnd;
        TryIfSetInst::FreeBody((TryIfSetInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_97[1].super_Inst;
        break;
      case TryMatchSet:
        actualInst_98 = (BeginAssertionInst *)instEnd;
        TryMatchSetInst::FreeBody((TryMatchSetInst *)instEnd,(ArenaAllocator *)inst);
        instEnd = (Inst *)((long)&actualInst_98[3].super_BodyGroupsMixin.minBodyGroupId + 2);
        break;
      case BeginAssertion:
        actualInst_99 = (EndAssertionInst *)instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = &actualInst_99[0xe].super_Inst;
        break;
      case EndAssertion:
        local_348 = instEnd;
        Inst::FreeBody(instEnd,(ArenaAllocator *)inst);
        instEnd = local_348 + 1;
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x1669,"(false)","false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    } while (instEnd < actualInst);
    if ((NopInst *)instEnd != actualInst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x166d,"(inst == instEnd)","inst == instEnd");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    local_350 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<unsigned_char>::operator=(&(this->rep).insts.insts,&local_350);
    (this->rep).insts.instsLen = 0;
  }
  return;
}

Assistant:

void Program::FreeBody(ArenaAllocator* rtAllocator)
    {
        if (tag != ProgramTag::InstructionsTag || !rep.insts.insts)
        {
            return;
        }

        Inst *inst = reinterpret_cast<Inst *>(PointerValue(rep.insts.insts));
        const auto instEnd = reinterpret_cast<Inst *>(reinterpret_cast<uint8 *>(inst) + rep.insts.instsLen);
        Assert(inst < instEnd);
        do
        {
            switch(inst->tag)
            {
#define MBase(TagName, ClassName) \
                case Inst::InstTag::TagName: \
                { \
                    const auto actualInst = static_cast<ClassName *>(inst); \
                    actualInst->FreeBody(rtAllocator); \
                    inst = actualInst + 1; \
                    break; \
                }
#define M(TagName) MBase(TagName, TagName##Inst)
#define MTemplate(TagName, TemplateDeclaration, GenericClassName, SpecializedClassName) MBase(TagName, SpecializedClassName)
#include "RegexOpCodes.h"
#undef MBase
#undef M
#undef MTemplate
                default:
                    Assert(false);
                    __assume(false);
            }
        } while(inst < instEnd);
        Assert(inst == instEnd);

#if DBG
        rep.insts.insts = nullptr;
        rep.insts.instsLen = 0;
#endif
    }